

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O0

void __thiscall
ear::throw_if_not_implemented::operator()(throw_if_not_implemented *this,CartesianPosition *param_1)

{
  not_implemented *this_00;
  allocator<char> local_39;
  string local_38;
  CartesianPosition *local_18;
  CartesianPosition *param_1_local;
  throw_if_not_implemented *this_local;
  
  local_18 = param_1;
  param_1_local = (CartesianPosition *)this;
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"cartesian",&local_39);
  not_implemented::not_implemented(this_00,&local_38);
  __cxa_throw(this_00,&not_implemented::typeinfo,not_implemented::~not_implemented);
}

Assistant:

void operator()(const CartesianPosition&) const {
      throw not_implemented("cartesian");
    }